

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.c
# Opt level: O2

void maybe_tutorial(void)

{
  obj *poVar1;
  level *plVar2;
  schar sVar3;
  boolean bVar4;
  char cVar5;
  ushort uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  monst *pmVar10;
  long lVar11;
  vptrs *pvVar12;
  uint uVar13;
  int dx;
  int iVar14;
  int iVar15;
  obj **ppoVar16;
  int lx;
  uint uVar17;
  bool bVar18;
  
  if (flags.tutorial == '\0') {
    return;
  }
  bVar4 = check_tutorial_message(0xc9);
  if (bVar4 != '\0') {
    return;
  }
  if (3 < moves) {
    iVar8 = -1;
    for (iVar14 = -1; iVar15 = -1, iVar14 != 2; iVar14 = iVar14 + 1) {
      for (; plVar2 = level, iVar15 != 2; iVar15 = iVar15 + 1) {
        if (((iVar14 + u.ux) - 1U < 0x4f) && (uVar13 = u.uy + iVar15, uVar13 < 0x15)) {
          uVar17 = u.ux + iVar14;
          bVar4 = check_tutorial_location(uVar17,uVar13,'\0');
          if (bVar4 != '\0') {
            return;
          }
          if (((plVar2->locations[uVar17][uVar13].field_0x6 & 8) != 0) &&
             (bVar4 = check_tutorial_message(0xd5), bVar4 != '\0')) {
            return;
          }
          iVar7 = dbuf_get_mon(uVar17,uVar13);
          if (iVar7 != 0) {
            iVar7 = dbuf_get_mon(uVar17,uVar13);
            if ((iVar8 == iVar7 + -1) && (bVar4 = check_tutorial_message(0x10d), bVar4 != '\0')) {
              return;
            }
            iVar8 = dbuf_get_mon(uVar17,uVar13);
            iVar8 = iVar8 + -1;
          }
        }
      }
    }
  }
  iVar8 = tutorial_last_combat;
  tutorial_last_combat = tutorial_last_combat + 1;
  bVar18 = tutorial_last_combat == 0;
  pmVar10 = (monst *)&level->monlist;
  while (pmVar10 = pmVar10->nmon, pmVar10 != (monst *)0x0) {
    if (((0 < pmVar10->mhp) && ((viz_array[pmVar10->my][pmVar10->mx] & 2U) != 0)) &&
       (pmVar10->mtame == '\0')) {
      tutorial_last_combat = 0;
      bVar18 = true;
    }
  }
  if ((bool)(bVar18 & 4 < iVar8)) {
    if ((('\x02' < u.uz.dlevel) && (flags.elbereth_enabled != '\0')) &&
       (bVar4 = check_tutorial_message(0x125), bVar4 != '\0')) {
      return;
    }
    for (lVar11 = 0; lVar11 != 0x2b; lVar11 = lVar11 + 1) {
      if (spl_book[lVar11].sp_id == 0x187) {
        bVar4 = check_tutorial_message(0x122);
        if (bVar4 != '\0') {
          return;
        }
      }
      else if (spl_book[lVar11].sp_id == 0) break;
    }
    bVar4 = check_tutorial_message(0x126);
    if (bVar4 != '\0') {
      return;
    }
  }
  if (((spl_book[1].sp_id != 0) &&
      ((((uarm != (obj *)0x0 &&
         ((ushort)((*(ushort *)&objects[uarm->otyp].field_0x11 >> 4 & 0x1f) - 0xb) < 7)) ||
        (((uarms != (obj *)0x0 && (urole.malenum != 0x161)) ||
         ((((uarmh != (obj *)0x0 && ((long)uarmh->otyp != 0x51)) &&
           (0xfff8 < (ushort)((*(ushort *)&objects[uarmh->otyp].field_0x11 >> 4 & 0x1f) - 0x12))) ||
          ((uarmg != (obj *)0x0 &&
           ((ushort)((*(ushort *)&objects[uarmg->otyp].field_0x11 >> 4 & 0x1f) - 0xb) < 7)))))))) ||
       ((uarmf != (obj *)0x0 &&
        ((ushort)((*(ushort *)&objects[uarmf->otyp].field_0x11 >> 4 & 0x1f) - 0xb) < 7)))))) &&
     (bVar4 = check_tutorial_message(0x154), bVar4 != '\0')) {
    return;
  }
  if (((uwep != &zeroobj && uwep != (obj *)0x0) && (iVar14 = weapon_dam_bonus(uwep), iVar14 < 0)) &&
     ((u.twoweap == '\0' && (bVar4 = check_tutorial_message(0x155), bVar4 != '\0')))) {
    return;
  }
  if (1 < u.ulevel) {
    bVar4 = check_tutorial_message(0x140);
    if (bVar4 != '\0') {
      return;
    }
    if ((2 < u.ulevel) && (bVar4 = check_tutorial_message(0x141), bVar4 != '\0')) {
      return;
    }
  }
  sVar3 = tutorial_old_attribs.a[0];
  iVar14 = 0;
  for (lVar11 = 0; lVar11 != 6; lVar11 = lVar11 + 1) {
    cVar5 = u.acurr.a[lVar11];
    if (tutorial_old_attribs.a[lVar11] < cVar5) {
      iVar14 = 1;
    }
    if (cVar5 < tutorial_old_attribs.a[lVar11]) {
      iVar14 = -1;
    }
    tutorial_old_attribs.a[lVar11] = cVar5;
  }
  if (sVar3 != '\0') {
    if (iVar14 < 1) {
      if (-1 < iVar14) goto LAB_0025c1da;
      iVar14 = 0x143;
    }
    else {
      iVar14 = 0x142;
    }
    bVar4 = check_tutorial_message(iVar14);
    if (bVar4 != '\0') {
      return;
    }
  }
LAB_0025c1da:
  iVar14 = (int)u.uac;
  if (tutorial_old_ac != 300 && iVar14 < tutorial_old_ac) {
    bVar4 = check_tutorial_message(0x148);
    if (bVar4 != '\0') {
      return;
    }
    iVar14 = (int)u.uac;
  }
  tutorial_old_ac = iVar14;
  if (u.uprops[0x1d].intrinsic == 0 && u.uprops[0x1c].intrinsic == 0) {
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0025c250;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0025c247;
LAB_0025c279:
      if (((((u.uprops[0x1b].intrinsic == 0) && (u.umonnum != 0x9e)) &&
           ((youmonst.data)->mlet != '\x1c')) &&
          (((u.uprops[0x23].intrinsic == 0 || (u.uprops[0x24].extrinsic != 0)) ||
           ((u.umonnum != u.umonster && (bVar4 = dmgtype(youmonst.data,0x24), bVar4 != '\0')))))) &&
         (u.uprops[0x3a].intrinsic == 0)) goto LAB_0025c2ed;
    }
    else {
LAB_0025c247:
      if (ublindf != (obj *)0x0) {
LAB_0025c250:
        if (ublindf->oartifact == '\x1d') goto LAB_0025c279;
      }
    }
  }
  bVar4 = check_tutorial_message(0x14c);
  if (bVar4 != '\0') {
    return;
  }
LAB_0025c2ed:
  if ((((u.uz.dlevel < '\x02') ||
       ((bVar4 = check_tutorial_message(0x144), bVar4 == '\0' &&
        ((u.uz.dlevel < '\n' || (bVar4 = check_tutorial_message(0x113), bVar4 == '\0')))))) &&
      (((u.uhpmax <= u.uhp || (bVar4 = check_tutorial_message(0x145), bVar4 == '\0')) &&
       ((((u.uenmax <= u.uen || (bVar4 = check_tutorial_message(0x146), bVar4 == '\0')) &&
         ((4 < u.uen || ((u.uenmax < 0xb || (bVar4 = check_tutorial_message(0x147), bVar4 == '\0')))
          ))) && (((u.umonster == u.umonnum ||
                   (bVar4 = check_tutorial_message(0x14e), bVar4 == '\0')) &&
                  ((((u.uexp < 1 || (bVar4 = check_tutorial_message(0x149), bVar4 == '\0')) &&
                    ((u.uhs < 2 || (bVar4 = check_tutorial_message(0x14a), bVar4 == '\0')))) &&
                   ((u.uhs != 0 || (bVar4 = check_tutorial_message(0x14b), bVar4 == '\0'))))))))))))
     && (((bVar4 = can_advance_something(), bVar4 == '\0' ||
          (bVar4 = check_tutorial_message(0x14d), bVar4 == '\0')) &&
         ((((((u._1052_1_ & 1) == 0 || (bVar4 = check_tutorial_message(0x156), bVar4 == '\0')) &&
            ((iVar14 = near_capacity(), iVar14 < 1 ||
             (bVar4 = check_tutorial_message(0x151), bVar4 == '\0')))) &&
           ((((iVar14 = in_trouble(), iVar14 < 1 || (bVar4 = can_pray('\0'), bVar4 == '\0')) ||
             (level->locations[u.ux][u.uy].typ == '!')) ||
            (bVar4 = check_tutorial_message(0x150), bVar4 == '\0')))) &&
          (((cVar5 = inside_shop(level,u.ux,u.uy), cVar5 == '\0' ||
            (bVar4 = check_tutorial_message(0x168), bVar4 == '\0')) &&
           ((((u.uz.dnum != dungeon_topology.d_mines_dnum ||
              (bVar4 = check_tutorial_message(0x16a), bVar4 == '\0')) &&
             ((u.uz.dnum != dungeon_topology.d_sokoban_dnum ||
              (bVar4 = check_tutorial_message(0x16b), bVar4 == '\0')))) &&
            ((check_tutorial_command_message != 0x112 ||
             (bVar4 = check_tutorial_message(0x112), bVar4 == '\0')))))))))))) {
    ppoVar16 = &invent;
    uVar17 = 0;
    uVar13 = 0;
LAB_0025c534:
    do {
      ppoVar16 = &((obj *)ppoVar16)->nobj->nobj;
      if ((obj *)ppoVar16 == (obj *)0x0) {
        if (((uVar13 & uVar17) != 0) && (bVar4 = check_tutorial_message(0x124), bVar4 != '\0')) {
          return;
        }
        pvVar12 = (vptrs *)(level->objects[u.ux] + u.uy);
        while (poVar1 = pvVar12->v_nexthere, poVar1 != (obj *)0x0) {
          uVar13 = (ushort)poVar1->otyp - 0xda;
          if (((uVar13 < 4) && (uVar13 != 2)) &&
             (bVar4 = check_tutorial_message(0x135), bVar4 != '\0')) {
            return;
          }
          pvVar12 = &poVar1->v;
        }
        if (tutorial_last_combat < 6) {
          return;
        }
        if ((0 < check_tutorial_command_message) &&
           (bVar4 = check_tutorial_message(check_tutorial_command_message), bVar4 != '\0')) {
          return;
        }
        if (moves < 10) {
          return;
        }
        bVar4 = check_tutorial_message(0x118);
        if (bVar4 != '\0') {
          return;
        }
        if (moves < 0x1e) {
          return;
        }
        bVar4 = check_tutorial_message(0x119);
        if (bVar4 != '\0') {
          return;
        }
        if (moves < 0x3c) {
          return;
        }
        bVar4 = check_tutorial_message(0x11a);
        if (bVar4 != '\0') {
          return;
        }
        if (moves < 100) {
          return;
        }
        bVar4 = check_tutorial_message(0x11b);
        if (bVar4 != '\0') {
          return;
        }
        if (moves < 0x96) {
          return;
        }
        check_tutorial_message(0x11c);
        return;
      }
      if (((~*(uint *)&((obj *)ppoVar16)->field_0x4a & 0x41) == 0) &&
         (bVar4 = check_tutorial_message(0x152), bVar4 != '\0')) {
        return;
      }
      if ((((obj *)ppoVar16)->oartifact != '\0') &&
         (bVar4 = check_tutorial_message(0x13e), bVar4 != '\0')) {
        return;
      }
      if (((((obj *)ppoVar16)->field_0x4a & 4) != 0) &&
         (bVar4 = check_tutorial_message(0x169), bVar4 != '\0')) {
        return;
      }
      uVar6 = ((obj *)ppoVar16)->otyp;
      if ((objects[(short)uVar6].field_0x10 & 1) == 0) {
        switch(objects[(short)uVar6].oc_class) {
        case '\x04':
        case '\x05':
switchD_0025c5c9_caseD_4:
          bVar4 = check_tutorial_message(0x13f);
          if (bVar4 != '\0') {
            return;
          }
          uVar6 = ((obj *)ppoVar16)->otyp;
          break;
        case '\b':
          if ((uVar6 != 0x14f) && (uVar6 != 0x17c)) goto switchD_0025c5c9_caseD_a;
          break;
        case '\t':
          if ((1 < uVar6 - 0x1bc) && (uVar6 != 0x17c)) goto switchD_0025c5c9_caseD_4;
          break;
        case '\n':
        case '\v':
switchD_0025c5c9_caseD_a:
          if ((uVar6 & 0xfffe) != 0x1bc) goto switchD_0025c5c9_caseD_4;
        }
      }
      uVar9 = uVar6 - 0xda;
      if (((uVar9 < 7) &&
          (((0x6bU >> (uVar9 & 0x1f) & 1) != 0 ||
           (((uVar9 == 4 && (urole.malenum != 0x159)) && (urole.malenum != 0x164)))))) &&
         (bVar4 = check_tutorial_message(0x135), bVar4 != '\0')) {
        return;
      }
    } while (tutorial_last_combat != 0 || iVar8 < 5);
    uVar6 = ((obj *)ppoVar16)->otyp;
    uVar9 = (uint)uVar6;
    if (0x14 < uVar6) {
LAB_0025c6ed:
      if (uVar6 - 0x42 < 4) {
        uVar13 = uVar13 | 1;
      }
      else if (uVar6 - 0x212 < 2) {
        uVar17 = uVar17 | 4;
      }
      else if (uVar9 == 0x46) {
        uVar13 = uVar13 | 4;
      }
      else if (uVar9 == 0x47) {
        uVar13 = uVar13 | 2;
      }
      goto LAB_0025c534;
    }
    if ((0x1ebf80U >> (uVar6 & 0x1f) & 1) == 0) {
      if ((0x3eU >> (uVar9 & 0x1f) & 1) == 0) {
        if (uVar9 != 6) goto LAB_0025c6ed;
        uVar17 = uVar17 | 2;
      }
      else {
        uVar17 = uVar17 | 1;
      }
      goto LAB_0025c534;
    }
    if (((obj *)ppoVar16 == uwep) || (bVar4 = check_tutorial_message(0x123), bVar4 == '\0'))
    goto LAB_0025c534;
  }
  return;
}

Assistant:

void maybe_tutorial(void)
{
	int old_tutorial_last_combat;
	int i;
	const struct monst *mtmp;

	if (!flags.tutorial) return; /* short-circuit */

	/* Check to see if any tutorial triggers have occured.
	   Stop checking once one message is output. */

	/* Welcome message: show immediately */
	if (check_tutorial_message(QT_T_WELCOME)) return;

	/* Check surroundings; these only occur if at least 3 turns
	   have elapsed, to avoid overwhelming the player early on. */
	if (moves > 3) {
	    int dx, dy;
	    int monnum = -1;
	    for (dx = -1; dx <= 1; dx++) {
		for (dy = -1; dy <= 1; dy++) {
		    if (isok(u.ux + dx, u.uy + dy)) {
			int lx = u.ux + dx;
			int ly = u.uy + dy;
			const struct rm *l = &level->locations[lx][ly];

			/* Terrain checks */
			if (check_tutorial_location(lx, ly, FALSE)) return;

			/* Adjacent invisible monsters */
			if (l->mem_invis)
			    if (check_tutorial_message(QT_T_LOOK_INVISIBLE)) return;

			/* More than one of the same monster adjacent */
			if (dbuf_get_mon(lx, ly)) {
			    if (monnum == (dbuf_get_mon(lx, ly) - 1))
				if (check_tutorial_message(QT_T_CALLMONSTER)) return;
			    monnum = dbuf_get_mon(lx, ly) - 1;
			}
		    }
		}
	    }
	}

	/* Check to see if we're in combat. */
	tutorial_last_combat++;
	old_tutorial_last_combat = tutorial_last_combat;
	for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon)
	    if (!DEADMONSTER(mtmp) && cansee(mtmp->mx, mtmp->my) && !mtmp->mtame)
		tutorial_last_combat = 0;

	/* Ambient messages that only come up during combat, and only one
	   message per combat */
	if (!tutorial_last_combat && old_tutorial_last_combat > 5) {
	    if (u.uz.dlevel >= 3)
		if (flags.elbereth_enabled &&
		    check_tutorial_message(QT_T_ELBERETH)) return;
	    for (i = 0; i < MAXSPELL && spellid(i) != NO_SPELL; i++) {
		if (spellid(i) == SPE_FORCE_BOLT)
		    if (check_tutorial_message(QT_T_SPELLS)) return;
	    }
	    if (check_tutorial_message(QT_T_MELEE)) return;
	}

	/* Events! */

	if (spellid(1)) {
	    if ((uarm && is_metallic(uarm)) ||
		(uarms && !Role_if(PM_PRIEST)) || /* priests start with shields */
		(uarmh && is_metallic(uarmh) && uarmh->otyp != HELM_OF_BRILLIANCE) ||
		(uarmg && is_metallic(uarmg)) ||
		(uarmf && is_metallic(uarmf)))
		if (check_tutorial_message(QT_T_CASTER_ARMOR)) return;
	}

	if (uwep && uwep != &zeroobj && weapon_dam_bonus(uwep) < 0 && !u.twoweap)
	    if (check_tutorial_message(QT_T_WEAPON_SKILL)) return;
	if (u.ulevel >= 2)
	    if (check_tutorial_message(QT_T_LEVELUP)) return;
	if (u.ulevel >= 3)
	    if (check_tutorial_message(QT_T_RANKUP)) return;
	{
	    int incdec = 0;
	    boolean firstturn = tutorial_old_attribs.a[0] == 0;
	    for (i = 0; i < A_MAX; i++) {
		if (u.acurr.a[i] > tutorial_old_attribs.a[i]) incdec = 1;
		if (u.acurr.a[i] < tutorial_old_attribs.a[i]) incdec = -1;
		tutorial_old_attribs.a[i] = u.acurr.a[i];
	    }
	    if (!firstturn) {
		if (incdec > 0)
		    if (check_tutorial_message(QT_T_ABILUP)) return;
		if (incdec < 0)
		    if (check_tutorial_message(QT_T_ABILDOWN)) return;
	    }
	}
	if (u.uac < tutorial_old_ac && tutorial_old_ac != TUTORIAL_IMPOSSIBLE_AC)
	    if (check_tutorial_message(QT_T_ACIMPROVED)) return;
	tutorial_old_ac = u.uac;

	if (Confusion || Sick || Blind || Stunned || Hallucination || Slimed)
	    if (check_tutorial_message(QT_T_STATUS)) return;

	if (u.uz.dlevel >= 2)
	    if (check_tutorial_message(QT_T_DLEVELCHANGE)) return;
	if (u.uz.dlevel >= 10)
	    if (check_tutorial_message(QT_T_DGN_OVERVIEW)) return;

	if (u.uhp < u.uhpmax)
	    if (check_tutorial_message(QT_T_DAMAGED)) return;
	if (u.uen < u.uenmax)
	    if (check_tutorial_message(QT_T_PWUSED)) return;
	if (u.uen < 5 && u.uenmax > 10)
	    if (check_tutorial_message(QT_T_PWEMPTY)) return;

	if (u.umonster != u.umonnum)
	    if (check_tutorial_message(QT_T_POLYSELF)) return;

	if (u.uexp > 0)
	    if (check_tutorial_message(QT_T_GAINEDEXP)) return;

	if (u.uhs >= HUNGRY)
	    if (check_tutorial_message(QT_T_HUNGER)) return;
	if (u.uhs <= SATIATED)
	    if (check_tutorial_message(QT_T_SATIATION)) return;

	if (can_advance_something())
	    if (check_tutorial_message(QT_T_ENHANCE)) return;

	if (u.uswallow)
	    if (check_tutorial_message(QT_T_ENGULFED)) return;

	if (near_capacity() > UNENCUMBERED)
	    if (check_tutorial_message(QT_T_BURDEN)) return;

	if (in_trouble() > 0 && can_pray(0) &&
	    !IS_ALTAR(level->locations[u.ux][u.uy].typ))
	    if (check_tutorial_message(QT_T_MAJORTROUBLE)) return;

	if (inside_shop(level, u.ux, u.uy))
	    if (check_tutorial_message(QT_T_SHOPENTRY)) return;

	if (u.uz.dnum == mines_dnum)
	    if (check_tutorial_message(QT_T_MINES)) return;
	if (u.uz.dnum == sokoban_dnum)
	    if (check_tutorial_message(QT_T_SOKOBAN)) return;
	if (check_tutorial_command_message == QT_T_FIRE)
	    if (check_tutorial_message(QT_T_FIRE)) return;

	/* Item-dependent events. */

	{
	    int projectile_groups = 0;
	    int launcher_groups = 0;
	    struct obj *otmp;

	    for (otmp = invent; otmp; otmp = otmp->nobj) {
		if (otmp->bknown && otmp->cursed)
		    if (check_tutorial_message(QT_T_EQUIPCURSE)) return;

		if (otmp->oartifact)
		    if (check_tutorial_message(QT_T_ARTIFACT)) return;

		if (otmp->unpaid)
		    if (check_tutorial_message(QT_T_SHOPBUY)) return;

		if (!objects[otmp->otyp].oc_name_known) {
		    switch (objects[otmp->otyp].oc_class) {
		    case POTION_CLASS:
			if (otmp->otyp == POT_WATER) break;
			/* fall through */
		    case SCROLL_CLASS:
			if (otmp->otyp == SCR_BLANK_PAPER) break;
			/* fall through */
		    case WAND_CLASS:
		    case SPBOOK_CLASS:
			if (otmp->otyp == SPE_BLANK_PAPER) break;
			if (otmp->otyp == SPE_BOOK_OF_THE_DEAD) break;
			/* fall through */
		    case RING_CLASS:
		    case AMULET_CLASS:
			if (check_tutorial_message(QT_T_RANDAPPEARANCE)) return;
			break;
		    default:
			break;
		    }
		}

		/* Containers; minor spoiler here, in that it doesn't trigger
		   off a bag of tricks and a savvy player might notice that, but
		   that's not a freebie I'm worried about. */
		switch (otmp->otyp) {
		case SACK:
		    /* starting inventory for arcs/rogues, and we don't want to
		       give the message until a second container's listed */
		    if (Role_if(PM_ARCHEOLOGIST)) break;
		    if (Role_if(PM_ROGUE)) break;
		    /* otherwise fall through */
		case LARGE_BOX:
		case CHEST:
		case ICE_BOX:
		case OILSKIN_SACK:
		case BAG_OF_HOLDING:
		    if (check_tutorial_message(QT_T_ITEM_CONTAINER)) return;
		    break;
		default:
		    break;
		}

		/* Requiring a specific item during combat... */
		if (!tutorial_last_combat && old_tutorial_last_combat > 5) {
		    switch (otmp->otyp) {
		    /* Projectiles. */
		    case ARROW:
		    case ELVEN_ARROW:
		    case ORCISH_ARROW:
		    case SILVER_ARROW:
		    case YA:
			projectile_groups |= 0x1;
			break;
		    case CROSSBOW_BOLT:
			projectile_groups |= 0x2;
			break;
		    case FLINT:
		    case ROCK:
			projectile_groups |= 0x4;
			break;

		    /* Launchers. */
		    case BOW:
		    case ELVEN_BOW:
		    case ORCISH_BOW:
		    case YUMI:
			launcher_groups |= 0x1;
			break;
		    case CROSSBOW:
			launcher_groups |= 0x2;
			break;
		    case SLING:
			launcher_groups |= 0x4;
			break;

		    /* Thrown weapons. Don't count our wielded weapon in this. */
		    case DART:
		    case SHURIKEN:
		    case BOOMERANG:
		    case SPEAR:
		    case ELVEN_SPEAR:
		    case ORCISH_SPEAR:
		    case DWARVISH_SPEAR:
		    case JAVELIN:
		    case DAGGER:
		    case ELVEN_DAGGER:
		    case ORCISH_DAGGER:
		    case SILVER_DAGGER:
			if (otmp == uwep) break;
			if (check_tutorial_message(QT_T_THROWNWEAPONS)) return;
			break;

		    default:
			break;
		    }
		}
	    }
	    if (projectile_groups & launcher_groups)
		if (check_tutorial_message(QT_T_PROJECTILES)) return;
	}

	/* Items on the current square. */
	{
	    struct obj *otmp;
	    for (otmp = level->objects[u.ux][u.uy]; otmp; otmp = otmp->nexthere) {
		switch (otmp->otyp) {
		case LARGE_BOX:
		case CHEST:
		case ICE_BOX:
		    if (check_tutorial_message(QT_T_ITEM_CONTAINER)) return;
		    break;
		default:
		    break;
		}
	    }
	}

	/* Ambient messages that only come up outside combat */
	if (tutorial_last_combat > 5) {
	    if (check_tutorial_command_message > 0)
		if (check_tutorial_message(check_tutorial_command_message)) return;
	    if (moves >= 10)
		if (check_tutorial_message(QT_T_VIEWTUTORIAL)) return;
	    if (moves >= 30)
		if (check_tutorial_message(QT_T_CHECK_ITEMS)) return;
	    if (moves >= 60)
		if (check_tutorial_message(QT_T_OBJECTIVE)) return;
	    if (moves >= 100)
		if (check_tutorial_message(QT_T_SAVELOAD)) return;
	    if (moves >= 150)
		if (check_tutorial_message(QT_T_MESSAGERECALL)) return;
	}
}